

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::CloneDebugInlinedAt
          (DebugInfoManager *this,uint32_t clone_inlined_at_id,Instruction *insert_before)

{
  bool bVar1;
  uint32_t res_id;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  IRContext *pIVar2;
  Instruction *pIVar3;
  pointer pIVar4;
  DefUseManager *this_01;
  undefined1 local_48 [16];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_inlined_at;
  Instruction *inlined_at;
  Instruction *insert_before_local;
  uint32_t clone_inlined_at_id_local;
  DebugInfoManager *this_local;
  
  this_00.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )GetDebugInlinedAt(this,clone_inlined_at_id);
  if (this_00.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl ==
      (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
    this_local = (DebugInfoManager *)0x0;
  }
  else {
    new_inlined_at._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
         (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
            )this_00.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    pIVar2 = context(this);
    pIVar3 = Instruction::Clone((Instruction *)
                                this_00.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl,pIVar2);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_38,pIVar3);
    pIVar4 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::operator->(&local_38);
    pIVar2 = context(this);
    res_id = IRContext::TakeNextId(pIVar2);
    Instruction::SetResultId(pIVar4,res_id);
    pIVar4 = std::
             unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ::get(&local_38);
    RegisterDbgInst(this,pIVar4);
    pIVar2 = context(this);
    bVar1 = IRContext::AreAnalysesValid(pIVar2,kAnalysisBegin);
    if (bVar1) {
      pIVar2 = context(this);
      this_01 = IRContext::get_def_use_mgr(pIVar2);
      pIVar4 = std::
               unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ::get(&local_38);
      DefUseManager::AnalyzeInstDefUse(this_01,pIVar4);
    }
    if (insert_before == (Instruction *)0x0) {
      pIVar2 = context(this);
      IRContext::module(pIVar2);
      Module::ext_inst_debuginfo_end((Module *)local_48);
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_48);
      this_local = (DebugInfoManager *)Instruction::InsertBefore(pIVar3,&local_38);
    }
    else {
      this_local = (DebugInfoManager *)Instruction::InsertBefore(insert_before,&local_38);
    }
    local_48._12_4_ = 1;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_38);
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* DebugInfoManager::CloneDebugInlinedAt(uint32_t clone_inlined_at_id,
                                                   Instruction* insert_before) {
  auto* inlined_at = GetDebugInlinedAt(clone_inlined_at_id);
  if (inlined_at == nullptr) return nullptr;
  std::unique_ptr<Instruction> new_inlined_at(inlined_at->Clone(context()));
  new_inlined_at->SetResultId(context()->TakeNextId());
  RegisterDbgInst(new_inlined_at.get());
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(new_inlined_at.get());
  if (insert_before != nullptr)
    return insert_before->InsertBefore(std::move(new_inlined_at));
  return context()->module()->ext_inst_debuginfo_end()->InsertBefore(
      std::move(new_inlined_at));
}